

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

Vector3f operator*(Matrix3f *m,Vector3f *v)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Vector3f *in_RDX;
  float *pfVar4;
  int i;
  long lVar5;
  int j;
  long lVar6;
  float fVar7;
  Vector3f VVar8;
  
  fVar7 = 0.0;
  Vector3f::Vector3f((Vector3f *)m,0.0,0.0,0.0);
  lVar5 = 0;
  do {
    lVar6 = 0;
    pfVar4 = v->m_elements;
    do {
      fVar1 = *pfVar4;
      pfVar3 = Vector3f::operator[](in_RDX,(int)lVar6);
      fVar2 = *pfVar3;
      pfVar3 = Vector3f::operator[]((Vector3f *)m,(int)lVar5);
      VVar8.m_elements[0] = fVar1 * fVar2 + *pfVar3;
      VVar8.m_elements[1] = 0.0;
      *pfVar3 = VVar8.m_elements[0];
      lVar6 = lVar6 + 1;
      pfVar4 = pfVar4 + 3;
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
    v = (Vector3f *)((long)v + 4);
  } while (lVar5 != 3);
  VVar8.m_elements[2] = fVar7;
  return (Vector3f)VVar8.m_elements;
}

Assistant:

Vector3f operator * ( const Matrix3f& m, const Vector3f& v )
{
	Vector3f output( 0, 0, 0 );

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}